

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall
cppcms::application::render
          (application *this,string *skin,string *template_name,base_content *content)

{
  manager *this_00;
  response *this_01;
  ostream *out;
  app_guard g;
  app_guard local_30;
  
  base_content::app_guard::app_guard(&local_30,content,this);
  this_00 = cppcms::service::views_pool(((this->d).ptr_)->service);
  this_01 = response(this);
  out = http::response::out(this_01);
  views::manager::render(this_00,skin,template_name,out,content);
  base_content::app_guard::~app_guard(&local_30);
  return;
}

Assistant:

void application::render(std::string skin,std::string template_name,base_content &content)
{
	base_content::app_guard g(content,*this);
	service().views_pool().render(skin,template_name,response().out(),content);
}